

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall
QRasterPaintEngine::drawPixmap(QRasterPaintEngine *this,QPointF *pos,QPixmap *pixmap)

{
  long lVar1;
  ClassId CVar2;
  int iVar3;
  TransformationType TVar4;
  QSpanData *fg;
  QRasterPaintEnginePrivate *pQVar5;
  QRasterPaintEngineState *pQVar6;
  QImage *in_RDX;
  QImage *in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal ypos;
  QPointF *p1;
  QRasterPaintEngineState *s_1;
  QRasterPaintEnginePrivate *d_1;
  QRasterPaintEngineState *s;
  QRasterPaintEnginePrivate *d;
  QImage *image;
  QPlatformPixmap *pd;
  QImage image_1;
  QImage *in_stack_fffffffffffffea0;
  QPixmap *in_stack_fffffffffffffea8;
  QImage *in_stack_fffffffffffffee8;
  QRasterBuffer *in_stack_fffffffffffffef0;
  QColor *this_00;
  undefined1 local_c0 [24];
  QPointF local_a8;
  QPointF local_98;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  QColor local_70;
  undefined1 local_60 [24];
  QPointF local_48;
  QImage *local_38;
  QImage *img;
  QPointF *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  img = local_38;
  fg = (QSpanData *)QPixmap::handle((QPixmap *)0x56a32e);
  CVar2 = QPlatformPixmap::classId((QPlatformPixmap *)fg);
  if (CVar2 == RasterClass) {
    iVar3 = QImage::depth((QImage *)&fg->fillRect);
    if (iVar3 == 1) {
      pQVar5 = d_func((QRasterPaintEngine *)0x56a380);
      pQVar6 = state((QRasterPaintEngine *)0x56a38f);
      TVar4 = QTransform::type((QTransform *)in_stack_fffffffffffffea8);
      if ((int)TVar4 < 2) {
        ensurePen((QRasterPaintEngine *)in_stack_fffffffffffffea0);
        qVar7 = QTransform::dx(&(pQVar6->super_QPainterState).matrix);
        ypos = QTransform::dy(&(pQVar6->super_QPainterState).matrix);
        QPointF::QPointF(&local_48,qVar7,ypos);
        ::operator+((QPointF *)in_stack_fffffffffffffea8,(QPointF *)in_stack_fffffffffffffea0);
        drawBitmap((QRasterPaintEngine *)this_00,(QPointF *)in_RSI,in_RDX,fg);
      }
      else {
        QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                  (&pQVar5->rasterBuffer);
        local_70 = QPen::color((QPen *)in_stack_fffffffffffffea8);
        QRasterBuffer::colorizeBitmap(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_RDI);
        (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI,local_60);
        QImage::~QImage(in_stack_fffffffffffffea0);
      }
    }
    else {
      drawImage((QRasterPaintEngine *)
                CONCAT26(in_stack_ffffffffffffffe6,
                         CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
                in_stack_ffffffffffffffd8,img);
    }
  }
  else {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::toImage(in_stack_fffffffffffffea8);
    iVar3 = QPixmap::depth((QPixmap *)in_stack_fffffffffffffea0);
    if (iVar3 == 1) {
      pQVar5 = d_func((QRasterPaintEngine *)0x56a592);
      pQVar6 = state((QRasterPaintEngine *)0x56a5a1);
      TVar4 = QTransform::type((QTransform *)in_stack_fffffffffffffea8);
      if ((int)TVar4 < 2) {
        ensurePen((QRasterPaintEngine *)in_stack_fffffffffffffea0);
        p1 = (QPointF *)QTransform::dx(&(pQVar6->super_QPainterState).matrix);
        qVar7 = QTransform::dy(&(pQVar6->super_QPainterState).matrix);
        QPointF::QPointF(&local_a8,(qreal)p1,qVar7);
        local_98 = ::operator+(p1,(QPointF *)in_stack_fffffffffffffea0);
        drawBitmap((QRasterPaintEngine *)this_00,(QPointF *)in_RSI,in_RDX,fg);
        in_RSI = in_stack_fffffffffffffea0;
      }
      else {
        QScopedPointer<QRasterBuffer,_QScopedPointerDeleter<QRasterBuffer>_>::operator->
                  (&pQVar5->rasterBuffer);
        QPen::color((QPen *)in_stack_fffffffffffffea8);
        QRasterBuffer::colorizeBitmap((QRasterBuffer *)pQVar5,(QImage *)pQVar6,in_RDI);
        (**(code **)(*(long *)in_RDI + 0x160))(in_RDI,in_RSI,local_c0);
        QImage::~QImage(in_RSI);
      }
    }
    else {
      drawImage((QRasterPaintEngine *)
                CONCAT26(in_stack_ffffffffffffffe6,
                         CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
                in_stack_ffffffffffffffd8,img);
      in_RSI = in_stack_fffffffffffffea0;
    }
    QImage::~QImage(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRasterPaintEngine::drawPixmap(const QPointF &pos, const QPixmap &pixmap)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawPixmap(), pos=" << pos << " pixmap=" << pixmap.size() << "depth=" << pixmap.depth();
#endif

    QPlatformPixmap *pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        const QImage &image = static_cast<QRasterPlatformPixmap *>(pd)->image;
        if (image.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate) {
                ensurePen();
                drawBitmap(pos + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
            } else {
                drawImage(pos, d->rasterBuffer->colorizeBitmap(image, s->pen.color()));
            }
        } else {
            QRasterPaintEngine::drawImage(pos, image);
        }
    } else {
        const QImage image = pixmap.toImage();
        if (pixmap.depth() == 1) {
            Q_D(QRasterPaintEngine);
            QRasterPaintEngineState *s = state();
            if (s->matrix.type() <= QTransform::TxTranslate) {
                ensurePen();
                drawBitmap(pos + QPointF(s->matrix.dx(), s->matrix.dy()), image, &s->penData);
            } else {
                drawImage(pos, d->rasterBuffer->colorizeBitmap(image, s->pen.color()));
            }
        } else {
            QRasterPaintEngine::drawImage(pos, image);
        }
    }
}